

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_trim(bitset_t *bitset)

{
  long lVar1;
  size_t sVar2;
  uint64_t *puVar3;
  size_t sVar4;
  _Bool _Var5;
  
  sVar2 = bitset->arraysize + 1;
  do {
    if (sVar2 == 1) {
      sVar4 = 0;
      break;
    }
    sVar4 = sVar2 - 1;
    lVar1 = sVar2 - 2;
    sVar2 = sVar4;
  } while (bitset->array[lVar1] == 0);
  _Var5 = true;
  if (bitset->capacity != sVar4) {
    puVar3 = (uint64_t *)roaring_realloc(bitset->array,sVar4 * 8);
    _Var5 = puVar3 != (uint64_t *)0x0;
    if (_Var5) {
      bitset->array = puVar3;
      bitset->capacity = sVar4;
      bitset->arraysize = sVar4;
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

bool bitset_trim(bitset_t *bitset) {
    size_t newsize = bitset->arraysize;
    while (newsize > 0) {
        if (bitset->array[newsize - 1] == 0)
            newsize -= 1;
        else
            break;
    }
    if (bitset->capacity == newsize) return true;  // nothing to do
    uint64_t *newarray;
    if ((newarray = (uint64_t *)roaring_realloc(
             bitset->array, sizeof(uint64_t) * newsize)) == NULL) {
        return false;
    }
    bitset->array = newarray;
    bitset->capacity = newsize;
    bitset->arraysize = newsize;
    return true;
}